

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_voxels.cpp
# Opt level: O0

BYTE * __thiscall FVoxelTexture::GetPixels(FVoxelTexture *this)

{
  BYTE BVar1;
  BYTE *pBVar2;
  int local_28;
  int i_1;
  int local_1c;
  PalEntry pe;
  int i;
  BYTE *pp;
  FVoxelTexture *this_local;
  
  if (this->Pixels == (BYTE *)0x0) {
    pBVar2 = (BYTE *)operator_new__(0x100);
    this->Pixels = pBVar2;
    _pe = this->SourceVox->Palette;
    if (_pe == (byte *)0x0) {
      for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
        this->Pixels[local_28] = (BYTE)local_28;
      }
    }
    else {
      for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
        PalEntry::PalEntry((PalEntry *)&i_1);
        i_1 = CONCAT31(CONCAT21(CONCAT11(i_1._3_1_,*_pe << 2 | (byte)((int)(uint)*_pe >> 4)),
                                _pe[1] << 2 | (byte)((int)(uint)_pe[1] >> 4)),
                       _pe[2] << 2 | (byte)((int)(uint)_pe[2] >> 4));
        BVar1 = FColorMatcher::Pick(&ColorMatcher,(PalEntry)i_1);
        this->Pixels[local_1c] = BVar1;
        _pe = _pe + 3;
      }
    }
  }
  return this->Pixels;
}

Assistant:

const BYTE *FVoxelTexture::GetPixels ()
{
	// GetPixels gets called when a translated palette is used so we still need to implement it here.
	if (Pixels == NULL)
	{
		Pixels = new BYTE[256];

		BYTE *pp = SourceVox->Palette;

		if(pp != NULL)
		{
			for(int i=0;i<256;i++, pp+=3)
			{
				PalEntry pe;
				pe.r = (pp[0] << 2) | (pp[0] >> 4);
				pe.g = (pp[1] << 2) | (pp[1] >> 4);
				pe.b = (pp[2] << 2) | (pp[2] >> 4);
				Pixels[i] = ColorMatcher.Pick(pe);
			}
		}
		else 
		{
			for(int i=0;i<256;i++, pp+=3)
			{
				Pixels[i] = (BYTE)i;
			}
		}  
	}
	return Pixels;
}